

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_chk2cmp2_8_al(void)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  uint uVar8;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
    return;
  }
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar8 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar8 = pmmu_translate_addr(uVar8);
  }
  uVar3 = m68k_read_memory_16(uVar8 & m68ki_cpu.address_mask);
  bVar1 = *(byte *)((long)m68ki_cpu.dar + (ulong)(uVar3 >> 10 & 0x3c));
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar8 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 4;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar8 = pmmu_translate_addr(uVar8);
  }
  uVar4 = m68k_read_memory_32(uVar8 & m68ki_cpu.address_mask);
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  uVar8 = uVar4;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar8 = pmmu_translate_addr(uVar4);
  }
  uVar5 = m68k_read_memory_8(uVar8 & m68ki_cpu.address_mask);
  uVar5 = (uint)(char)uVar5;
  uVar8 = uVar4 + 1;
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar8 = pmmu_translate_addr(uVar8);
  }
  uVar4 = m68k_read_memory_8(uVar8 & m68ki_cpu.address_mask);
  uVar4 = (uint)(char)uVar4;
  uVar6 = (uint)(char)bVar1;
  if ((short)uVar3 < 0) {
    uVar6 = (uint)bVar1;
  }
  m68ki_cpu.not_z_flag = (uint)(uVar5 != uVar6 && uVar4 != uVar6);
  if ((int)uVar4 < (int)uVar5) {
    bVar7 = (int)uVar4 < (int)uVar6;
    bVar2 = (int)uVar6 < (int)uVar5;
  }
  else {
    bVar7 = (int)uVar6 < (int)uVar5;
    bVar2 = (int)uVar4 < (int)uVar6;
  }
  m68ki_cpu.c_flag = (uint)(byte)(bVar2 | bVar7) << 8;
  if (((uVar3 >> 0xb & 1) != 0) && ((bVar2 | bVar7) != 0)) {
    m68ki_exception_trap(6);
    return;
  }
  return;
}

Assistant:

static void m68k_op_chk2cmp2_8_al(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		sint compare = REG_DA[(word2 >> 12) & 15]&0xff;
		uint ea = EA_AL_8();
		sint lower_bound = (int8)m68ki_read_8(ea);
		sint upper_bound = (int8)m68ki_read_8(ea + 1);

		if(!BIT_F(word2))
			compare = (int32)(int8)compare;
      
 		FLAG_Z = !((upper_bound==compare) || (lower_bound==compare));  // JFF: | => ||

    FLAG_C = (lower_bound <= upper_bound ? compare < lower_bound || compare > upper_bound : compare > upper_bound || compare < lower_bound) << 8;

		if(COND_CS() && BIT_B(word2))
				m68ki_exception_trap(EXCEPTION_CHK);
		return;
	}
	m68ki_exception_illegal();
}